

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators.h
# Opt level: O0

void __thiscall spdlog::populators::level_populator::~level_populator(level_populator *this)

{
  void *in_RDI;
  
  ~level_populator((level_populator *)0x16a808);
  operator_delete(in_RDI);
  return;
}

Assistant:

class SPDLOG_API level_populator : public pattern_populator
{
public:
    level_populator();
}